

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::AllocateInput(Codec *this)

{
  uint8_t *puVar1;
  ulong size;
  Codec *in_RDI;
  uint64_t sizeBytes;
  
  size = (long)(int)((uint)in_RDI->_block_count + (uint)in_RDI->_extra_count) *
         (ulong)in_RDI->_block_bytes;
  if (in_RDI->_input_allocated < size) {
    FreeInput(in_RDI);
    puVar1 = SIMDSafeAllocate(size);
    in_RDI->_input_blocks = puVar1;
    if (in_RDI->_input_blocks == (uint8_t *)0x0) {
      return false;
    }
    in_RDI->_input_allocated = size;
  }
  return true;
}

Assistant:

bool Codec::AllocateInput()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateInput ----" << endl << endl;)

    const uint64_t sizeBytes = static_cast<uint64_t>(_block_count + _extra_count) * _block_bytes;

    // If need to allocate more:
    if (_input_allocated < sizeBytes)
    {
        FreeInput();

        // Allocate input blocks
        _input_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_input_blocks) {
            return false;
        }

        _input_allocated = sizeBytes;
    }

    return true;
}